

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,FabOnDisk *fod)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"FabOnDisk:");
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,(string *)fod);
  poVar1 = std::operator<<(poVar1,' ');
  std::ostream::_M_insert<long>((long)poVar1);
  if (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0) {
    Error_host("Write of VisMF::FabOnDisk failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const VisMF::FabOnDisk& fod)
{
    os << TheFabOnDiskPrefix << ' ' << fod.m_name << ' ' << fod.m_head;

    if( ! os.good()) {
        amrex::Error("Write of VisMF::FabOnDisk failed");
    }

    return os;
}